

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

int __thiscall btConvexHullInternal::Int128::ucmp(Int128 *this,Int128 *b)

{
  Int128 *b_local;
  Int128 *this_local;
  int local_4;
  
  if (this->high < b->high) {
    local_4 = -1;
  }
  else if (b->high < this->high) {
    local_4 = 1;
  }
  else if (this->low < b->low) {
    local_4 = -1;
  }
  else if (b->low < this->low) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ucmp(const Int128&b) const
				{
					if (high < b.high)
					{
						return -1;
					}
					if (high > b.high)
					{
						return 1;
					}
					if (low < b.low)
					{
						return -1;
					}
					if (low > b.low)
					{
						return 1;
					}
					return 0;
				}